

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O2

void nhdp_db_link_addr_move(nhdp_link *lnk,nhdp_laddr *laddr)

{
  nhdp_neighbor *pnVar1;
  
  avl_remove(&laddr->link->_addresses,&laddr->_link_node);
  avl_insert(&lnk->_addresses,&laddr->_link_node);
  pnVar1 = laddr->link->neigh;
  if (pnVar1 != lnk->neigh) {
    avl_remove(&pnVar1->_link_addresses,&laddr->_neigh_node);
    avl_insert(&lnk->neigh->_link_addresses,&laddr->_neigh_node);
  }
  laddr->link = lnk;
  return;
}

Assistant:

void
nhdp_db_link_addr_move(struct nhdp_link *lnk, struct nhdp_laddr *laddr) {
  /* remove from old link */
  avl_remove(&laddr->link->_addresses, &laddr->_link_node);

  /* add to new neighbor */
  avl_insert(&lnk->_addresses, &laddr->_link_node);

  if (laddr->link->neigh != lnk->neigh) {
    /* remove from old neighbor */
    avl_remove(&laddr->link->neigh->_link_addresses, &laddr->_neigh_node);

    /* add to new neighbor */
    avl_insert(&lnk->neigh->_link_addresses, &laddr->_neigh_node);
  }
  /* set new backlink */
  laddr->link = lnk;
}